

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
flatbuffers::NewPythonCodeGenerator(void)

{
  PythonCodeGenerator *this;
  __uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
  in_RDI;
  unique_ptr<flatbuffers::(anonymous_namespace)::PythonCodeGenerator,_std::default_delete<flatbuffers::(anonymous_namespace)::PythonCodeGenerator>_>
  local_18 [2];
  
  this = (PythonCodeGenerator *)operator_new(0x28);
  memset(this,0,0x28);
  anon_unknown_27::PythonCodeGenerator::PythonCodeGenerator(this);
  std::
  unique_ptr<flatbuffers::(anonymous_namespace)::PythonCodeGenerator,std::default_delete<flatbuffers::(anonymous_namespace)::PythonCodeGenerator>>
  ::unique_ptr<std::default_delete<flatbuffers::(anonymous_namespace)::PythonCodeGenerator>,void>
            ((unique_ptr<flatbuffers::(anonymous_namespace)::PythonCodeGenerator,std::default_delete<flatbuffers::(anonymous_namespace)::PythonCodeGenerator>>
              *)local_18,this);
  std::unique_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>>::
  unique_ptr<flatbuffers::(anonymous_namespace)::PythonCodeGenerator,std::default_delete<flatbuffers::(anonymous_namespace)::PythonCodeGenerator>,void>
            ((unique_ptr<flatbuffers::CodeGenerator,std::default_delete<flatbuffers::CodeGenerator>>
              *)in_RDI.
                super___uniq_ptr_impl<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
                ._M_t.
                super__Tuple_impl<0UL,_flatbuffers::CodeGenerator_*,_std::default_delete<flatbuffers::CodeGenerator>_>
                .super__Head_base<0UL,_flatbuffers::CodeGenerator_*,_false>._M_head_impl,local_18);
  std::
  unique_ptr<flatbuffers::(anonymous_namespace)::PythonCodeGenerator,_std::default_delete<flatbuffers::(anonymous_namespace)::PythonCodeGenerator>_>
  ::~unique_ptr(local_18);
  return (__uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
          )(tuple<flatbuffers::CodeGenerator_*,_std::default_delete<flatbuffers::CodeGenerator>_>)
           in_RDI.
           super___uniq_ptr_impl<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_flatbuffers::CodeGenerator_*,_std::default_delete<flatbuffers::CodeGenerator>_>
           .super__Head_base<0UL,_flatbuffers::CodeGenerator_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<CodeGenerator> NewPythonCodeGenerator() {
  return std::unique_ptr<PythonCodeGenerator>(new PythonCodeGenerator());
}